

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int cubeb_stream_init(cubeb *context,cubeb_stream **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency,cubeb_data_callback data_callback,
                     cubeb_state_callback state_callback,void *user_ptr)

{
  cubeb_log_level cVar1;
  cubeb_log_callback p_Var2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  int *in_R8;
  undefined8 in_R9;
  int *in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  undefined8 in_stack_00000028;
  int r;
  int *piVar3;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  cubeb_stream_params *in_stack_ffffffffffffff78;
  bool local_69;
  bool local_55;
  int local_54;
  int local_1c;
  
  if ((((in_RDI == (long *)0x0) || (in_RSI == 0)) || (in_stack_00000018 == 0)) ||
     (in_stack_00000020 == 0)) {
    local_1c = -3;
  }
  else {
    local_54 = validate_stream_params
                         (in_stack_ffffffffffffff78,
                          (cubeb_stream_params *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if ((local_54 == 0) && (local_54 = validate_latency(in_stack_00000010), local_54 == 0)) {
      piVar3 = in_stack_00000008;
      local_1c = (**(code **)(*in_RDI + 0x48))
                           (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,
                            in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028)
      ;
      uVar4 = (undefined4)((ulong)piVar3 >> 0x20);
      if ((local_1c == -2) &&
         ((cVar1 = cubeb_log_get_level(), cVar1 != CUBEB_LOG_DISABLED &&
          (p_Var2 = cubeb_log_get_callback(), p_Var2 != (cubeb_log_callback)0x0)))) {
        local_55 = false;
        if (in_stack_00000008 != (int *)0x0) {
          local_55 = *in_stack_00000008 != 0;
        }
        local_69 = false;
        if (in_R8 != (int *)0x0) {
          local_69 = *in_R8 != 0;
        }
        cubeb_log_internal("cubeb.c",0x191,"Invalid format, %p %p %d %d",in_stack_00000008,in_R8,
                           (ulong)local_55,CONCAT44(uVar4,(uint)local_69));
      }
    }
    else {
      local_1c = local_54;
    }
  }
  return local_1c;
}

Assistant:

int
cubeb_stream_init(cubeb * context, cubeb_stream ** stream,
                  char const * stream_name, cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency, cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback, void * user_ptr)
{
  int r;

  if (!context || !stream || !data_callback || !state_callback) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if ((r = validate_stream_params(input_stream_params, output_stream_params)) !=
          CUBEB_OK ||
      (r = validate_latency(latency)) != CUBEB_OK) {
    return r;
  }

  r = context->ops->stream_init(context, stream, stream_name, input_device,
                                input_stream_params, output_device,
                                output_stream_params, latency, data_callback,
                                state_callback, user_ptr);

  if (r == CUBEB_ERROR_INVALID_FORMAT) {
    LOG("Invalid format, %p %p %d %d", output_stream_params,
        input_stream_params,
        output_stream_params && output_stream_params->format,
        input_stream_params && input_stream_params->format);
  }

  return r;
}